

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O2

float parseReal(char *str,int start,int len)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  ushort **ppuVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  
  if (start < 0 || str == (char *)0x0) {
    return 0.0;
  }
  dVar11 = 1.0;
  dVar10 = 0.0;
  pcVar2 = str + (uint)start;
  bVar6 = false;
  bVar3 = false;
  while (bVar5 = bVar6, iVar9 = len, pcVar7 = pcVar2 + 1, 0 < iVar9) {
    cVar1 = *pcVar2;
    if ((long)cVar1 == 0) break;
    bVar4 = true;
    pcVar2 = pcVar7;
    if ((byte)(cVar1 - 0x30U) < 10) {
      if (bVar5) {
        dVar11 = dVar11 * 0.1;
      }
      dVar10 = dVar10 * 10.0 + (double)(int)(char)(cVar1 - 0x30U);
LAB_001267c4:
      len = iVar9 + -1;
      bVar6 = bVar5;
      bVar3 = bVar4;
    }
    else {
      if (cVar1 == '+' && !bVar3) goto LAB_001267ac;
      if (cVar1 == '-' && !bVar3) {
        dVar11 = -1.0;
        goto LAB_001267c4;
      }
      if ((cVar1 != '.') || (len = iVar9 + -1, bVar6 = bVar4, bVar5)) {
        ppuVar8 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 0x20) == 0) ||
           (bVar4 = false, bVar3)) break;
LAB_001267ac:
        len = iVar9 + -1;
        bVar6 = bVar5;
        bVar3 = bVar4;
      }
    }
  }
  return (float)(dVar10 * dVar11);
}

Assistant:

float parseReal(char *str, int start, int len) {
   double value = 0.0, scale = 1.0;
   register char ch;
   int inside = 0, infract = 0;

   if (!str || start < 0) { return 0; }
   str += start;

   while((len-- > 0) && *str) {
      ch = *str++;
      if ((ch >='0') && (ch <= '9')) {
	 value = (10.0*value) + (ch - '0');
	 if (infract) { scale *= 0.1; }
	 inside = 1;
      }
      else if (ch == '+' && !inside) {
	 inside = 1;
      }
      else if (ch == '-' && !inside) {
	 scale = -1.0;
	 inside = 1;
      }
      else if (ch == '.' && !infract) {
	 infract = 1;
      }
      else if (isspace(ch) && !inside) { /* nothing */ }
      else break; /* end of real */
   }
   return value*scale;
}